

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall TPZFMatrix<long>::TPZFMatrix(TPZFMatrix<long> *this,TPZFMatrix<long> *A)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  long in_RSI;
  TPZRegisterClassId *in_RDI;
  long *p;
  long *src;
  int64_t size;
  int64_t in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  TPZManVector<int,_5> *in_stack_ffffffffffffffc0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<long>>(in_RDI,0x21);
  TPZMatrix<long>::TPZMatrix
            ((TPZMatrix<long> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,(int64_t)in_RDI);
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023f35c8;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8);
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x70));
  uVar2 = *(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10);
  if (uVar2 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)(in_RDI + 0x20) = pvVar4;
    memcpy(*(void **)(in_RDI + 0x20),*(void **)(in_RSI + 0x20),uVar2 * 8);
  }
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(const TPZFMatrix<TVar> &A)
: TPZRegisterClassId(&TPZFMatrix::ClassId),
TPZMatrix<TVar>( A.fRow, A.fCol ), fElem(0), fGiven(0), fSize(0) {
    int64_t size = this->fRow * this->fCol;
    if(!size) return;
    fElem = new TVar[ size ] ;
#ifdef PZDEBUG2
    if ( size && fElem == NULL ) Error( "Constructor <memory allocation error>." );
#endif
    // Copia a matriz
    TVar * src = A.fElem;
    TVar * p = fElem;
    memcpy((void *)(p),(void *)(src),(size_t)size*sizeof(TVar));
}